

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

bool __thiscall CProficiencies::InterpCommand(CProficiencies *this,char *command,char *argument)

{
  code *pcVar1;
  char *profname;
  PC_DATA *pPVar2;
  ushort uVar3;
  long lVar4;
  CProficiencies *pCVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  allocator<char> local_71;
  CProficiencies *local_70;
  ulong local_68;
  char *local_60;
  ulong local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (*command == '\0') {
    bVar8 = false;
  }
  else {
    bVar8 = (long)prof_cmd_table.super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)prof_cmd_table.super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0;
    if (bVar8) {
      local_68 = ((long)prof_cmd_table.
                        super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)prof_cmd_table.
                        super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      local_58 = local_68 + (local_68 == 0);
      lVar6 = 0x10;
      uVar7 = 0;
      local_70 = this;
      local_60 = argument;
      do {
        pcVar1 = *(code **)((long)prof_cmd_table.
                                  super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar6 + -8);
        profname = *(char **)((long)&(prof_cmd_table.
                                      super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->name + lVar6);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_50,
                   *(char **)((long)prof_cmd_table.
                                    super__Vector_base<prof_cmd_type,_std::allocator<prof_cmd_type>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x10),
                   &local_71);
        strlen(command);
        lVar4 = std::__cxx11::string::find((char *)local_50,(ulong)command,0);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (lVar4 == -1) {
          bVar8 = false;
        }
        else {
          uVar3 = ProfIndexLookup(profname);
          if (uVar3 == 0xffff || profname == "none") {
LAB_00378c50:
            (*pcVar1)(local_70->ch,local_60);
            bVar8 = true;
          }
          else {
            bVar8 = false;
            if (uVar3 < 0x19) {
              pPVar2 = local_70->ch->pcdata;
              if (pPVar2 == (PC_DATA *)0x0) {
                pCVar5 = &prof_none;
              }
              else {
                pCVar5 = &pPVar2->profs;
              }
              if (-1 < pCVar5->profs[uVar3]) goto LAB_00378c50;
            }
          }
        }
        if (bVar8) {
          return true;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x18;
      } while (local_58 != uVar7);
      bVar8 = uVar7 < local_68;
    }
  }
  return bVar8;
}

Assistant:

bool CProficiencies::InterpCommand(char *command, char *argument)
{
	if (strlen(command) == 0)
		return false;

	auto prof_cmd_table_size = std::size(prof_cmd_table);
	for (auto i = 0; i < prof_cmd_table_size; i++)
	{
		auto cmd = prof_cmd_table[i];
		auto foundPos = std::string(cmd.name).find(command);
		if (foundPos == std::string::npos)
			continue;
		
		auto pindex = ProfIndexLookup(cmd.requires);
		if (cmd.requires == "none" || pindex == -1 || ch->Profs()->HasProf(pindex))
		{
			(cmd.cmd) (ch, argument);
			return true;
		}
	}
			
	return false;
}